

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

void merge(block *b0,block *b1)

{
  edge *peVar1;
  block **local_28;
  block **local_20;
  block **p;
  block *b1_local;
  block *b0_local;
  
  local_20 = &b1_local;
  while (*local_20 != (block *)0x0) {
    if ((*local_20)->sense == 0) {
      peVar1 = &(*local_20)->et;
    }
    else {
      peVar1 = &(*local_20)->ef;
    }
    local_28 = &peVar1->succ;
    local_20 = local_28;
  }
  *local_20 = b1;
  return;
}

Assistant:

static void
merge(b0, b1)
	struct block *b0, *b1;
{
	register struct block **p = &b0;

	/* Find end of list. */
	while (*p)
		p = !((*p)->sense) ? &JT(*p) : &JF(*p);

	/* Concatenate the lists. */
	*p = b1;
}